

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGI.cpp
# Opt level: O0

bool __thiscall CGI::CheckCGI(CGI *this,CharContent *cgi_string,Response *response)

{
  size_t sVar1;
  size_t sVar2;
  vector<CharContent,_std::allocator<CharContent>_> local_128;
  CharContent local_110;
  int local_e4;
  CharContent local_e0;
  CharContent local_b8;
  undefined1 local_90 [8];
  CharContent temp;
  size_t local_58;
  size_t start;
  size_t pos;
  vector<CharContent,_std::allocator<CharContent>_> headers_line;
  bool one_line_space;
  Response *response_local;
  CharContent *cgi_string_local;
  CGI *this_local;
  
  sVar1 = CharContent::length(cgi_string);
  if (sVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    headers_line.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    std::vector<CharContent,_std::allocator<CharContent>_>::vector
              ((vector<CharContent,_std::allocator<CharContent>_> *)&pos);
    local_58 = 0;
    do {
      sVar1 = CharContent::find(cgi_string,"\n",1,local_58);
      if (sVar1 == cgi_string->npos) break;
      CharContent::subCharContent((CharContent *)local_90,cgi_string,local_58,sVar1 - local_58);
      CharContent::CharContent(&local_e0,"\r");
      CharContent::strip(&local_b8,(CharContent *)local_90,&local_e0);
      CharContent::operator=((CharContent *)local_90,&local_b8);
      CharContent::~CharContent(&local_b8);
      CharContent::~CharContent(&local_e0);
      sVar2 = CharContent::length((CharContent *)local_90);
      if (sVar2 == 0) {
        headers_line.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        local_e4 = 3;
      }
      else {
        std::vector<CharContent,_std::allocator<CharContent>_>::push_back
                  ((vector<CharContent,_std::allocator<CharContent>_> *)&pos,(value_type *)local_90)
        ;
        local_58 = sVar1 + 1;
        local_e4 = 0;
      }
      CharContent::~CharContent((CharContent *)local_90);
    } while (local_e4 == 0);
    if ((headers_line.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      sVar2 = CharContent::length(cgi_string);
      CharContent::subCharContent(&local_110,cgi_string,sVar1 + 1,~sVar1 + sVar2);
      CharContent::operator=(&response->Entity,&local_110);
      CharContent::~CharContent(&local_110);
      std::vector<CharContent,_std::allocator<CharContent>_>::vector
                (&local_128,(vector<CharContent,_std::allocator<CharContent>_> *)&pos);
      this_local._7_1_ = check_header(this,&local_128,response);
      std::vector<CharContent,_std::allocator<CharContent>_>::~vector(&local_128);
    }
    local_e4 = 1;
    std::vector<CharContent,_std::allocator<CharContent>_>::~vector
              ((vector<CharContent,_std::allocator<CharContent>_> *)&pos);
  }
  return this_local._7_1_;
}

Assistant:

bool CGI::CheckCGI(CharContent cgi_string,Response *response){
	if(cgi_string.length()==0)
		return false;
	bool one_line_space=false;
	std::vector<CharContent> headers_line;
	size_t pos=0,start=0;
	while((pos=cgi_string.find("\n",1,start))!=cgi_string.npos){
		CharContent temp=cgi_string.subCharContent(start,pos-start);
		temp=temp.strip("\r");
		if(temp.length()==0){
			one_line_space=true;
			break;
		}
		headers_line.push_back(temp);
		start=pos+1;
	}
	if(!one_line_space)
		return false;
	response->Entity=cgi_string.subCharContent(pos+1,cgi_string.length()-pos-1);
	return this->check_header(headers_line,response);
}